

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O1

parameters * parameters_get(int K)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  parameters *in_RDI;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  if (0 < K) {
    lVar8 = 0x10;
    do {
      iVar1 = *(int *)((long)&base_param_sets_sz + lVar8);
      if (K <= iVar1) {
        iVar2 = *(int *)(&UNK_001030e4 + lVar8);
        iVar4 = *(int *)(&UNK_001030e8 + lVar8);
        iVar5 = *(int *)(&UNK_001030ec + lVar8);
        iVar6 = *(int *)((long)&base_param_sets[0].Kprime + lVar8);
        bVar10 = lVar8 == 0x2554;
        goto LAB_001016d5;
      }
      lVar8 = lVar8 + 0x14;
    } while (lVar8 != 0x2554);
    iVar1 = 0;
    bVar10 = true;
    iVar2 = 0;
    iVar4 = 0;
    iVar5 = 0;
    iVar6 = 0;
LAB_001016d5:
    if (!bVar10) {
      iVar9 = iVar4 + iVar1 + iVar5;
      iVar7 = iVar9 - iVar6;
      lVar8 = 0;
      do {
        iVar3 = *(int *)((long)&nextprime_small_primes + lVar8);
        if (iVar7 <= iVar3) goto LAB_00101727;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x4bc);
      iVar3 = -1;
LAB_00101727:
      in_RDI->K = K;
      in_RDI->Kprime = iVar1;
      in_RDI->J = iVar2;
      in_RDI->L = iVar9;
      in_RDI->S = iVar4;
      in_RDI->H = iVar5;
      in_RDI->B = iVar6 - iVar4;
      in_RDI->W = iVar6;
      in_RDI->P = iVar7;
      in_RDI->P1 = iVar3;
      in_RDI->U = iVar7 - iVar5;
      return in_RDI;
    }
  }
  in_RDI->K = 0;
  in_RDI->Kprime = 0;
  in_RDI->J = 0;
  in_RDI->L = 0;
  in_RDI->W = 0;
  in_RDI->P = 0;
  in_RDI->P1 = 0;
  in_RDI->U = 0;
  in_RDI->S = 0;
  in_RDI->H = 0;
  in_RDI->B = 0;
  in_RDI->W = 0;
  in_RDI->K = -1;
  return in_RDI;
}

Assistant:

parameters parameters_get(int K)
{
	/* Input validation */
	if (K <= 0) {
		return (parameters){ -1 };
	}

	/* Determine Kprime, J, S, H and W from param_sets */
	parameters R = { .K = K };
	int i;
	for (i = 0; i < base_param_sets_sz; ++i) {
		if (K <= base_param_sets[i].Kprime) {
			const base_param_set* P = &base_param_sets[i];
			R.Kprime = P->Kprime;
			R.J = P->J;
			R.S = P->S;
			R.H = P->H;
			R.W = P->W;
			break;
		}
	}
	if (i == base_param_sets_sz) {
		return (parameters){ -1 };
	}

	/* Assign the remaining variables */
	R.L = R.Kprime + R.S + R.H;
	R.P = R.L - R.W;
	R.P1 = nextprime(R.P);
	R.U = R.P - R.H;
	R.B = R.W - R.S;

	return R;
}